

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_> *
Utils::fillItemIdList
          (vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
           *__return_storage_ptr__,int count,const_iterator it)

{
  uchar *__last;
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  pointer puVar4;
  uint uVar5;
  ItemIDList itemIdList;
  value_type local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < count) {
    do {
      local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __last = it._M_current + 2;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (it._M_current,__last,&local_78.ItemIDSize);
      puVar4 = local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
      puVar2 = local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start < puVar4 &&
          local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          puVar3 = puVar2 + 1;
          uVar5 = *puVar2;
          *puVar2 = *puVar4;
          *puVar4 = uVar5;
          puVar4 = puVar4 + -1;
          puVar2 = puVar3;
        } while (puVar3 < puVar4);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_48,&local_78.ItemIDSize);
      uVar5 = *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start << 8 |
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[1];
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      it._M_current = __last + (long)(int)uVar5 + -2;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__last,it._M_current,
                 (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
                 &local_78.Data);
      puVar4 = local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish + -1;
      puVar2 = local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start < puVar4 &&
          local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          puVar3 = puVar2 + 1;
          uVar1 = *puVar2;
          *puVar2 = *puVar4;
          *puVar4 = uVar1;
          puVar4 = puVar4 + -1;
          puVar2 = puVar3;
        } while (puVar3 < puVar4);
      }
      std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
      push_back(__return_storage_ptr__,&local_78);
      if (local_78.Data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.Data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.Data.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.Data.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.ItemIDSize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ItemIDSize.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.ItemIDSize.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.ItemIDSize.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      count = count - uVar5;
    } while (0 < count);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LinkTargetIDList::ItemIDList> Utils::fillItemIdList(int count, std::vector<unsigned char>::const_iterator it) {
    std::vector<LinkTargetIDList::ItemIDList> IDList;
    while (count > 0) {
        LinkTargetIDList::ItemIDList itemIdList;
        copy(it, it + 2, std::back_inserter(itemIdList.ItemIDSize));          // 2 byte
        it = it + 2;
        reverse(itemIdList.ItemIDSize.begin(), itemIdList.ItemIDSize.end());
        int itemIDSize = Utils::lenTwoBytes(itemIdList.ItemIDSize);

        copy(it, it + itemIDSize - 2, std::back_inserter(itemIdList.Data));       // itemIDSize byte
        reverse(itemIdList.Data.begin(), itemIdList.Data.end());
        it = it + itemIDSize - 2;

        IDList.push_back(itemIdList);
        count = count - itemIDSize;
    }
    return IDList;
}